

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O2

void __thiscall
BlindFactor_Constractor_bytedata_Test::TestBody(BlindFactor_Constractor_bytedata_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_1;
  string local_88;
  ByteData bytedata_err;
  AssertHelper local_50;
  BlindFactor blind_factor;
  ByteData bytedata;
  
  std::__cxx11::string::string
            ((string *)&blind_factor,
             "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
             (allocator *)&local_88);
  cfd::core::ByteData::ByteData(&bytedata,(string *)&blind_factor);
  std::__cxx11::string::~string((string *)&blind_factor);
  cfd::core::BlindFactor::BlindFactor(&blind_factor,&bytedata);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_88,&blind_factor);
  testing::internal::CmpHelperSTREQ
            ((internal *)&bytedata_err,"blind_factor.GetHex().c_str()",
             "\"7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18\"",
             local_88._M_dataplus._M_p,
             "7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18");
  std::__cxx11::string::~string((string *)&local_88);
  if ((char)bytedata_err.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (bytedata_err.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)bytedata_err.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bytedata_err.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::BlindFactor::GetData((ByteData256 *)&bytedata_err,&blind_factor);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_88,(ByteData256 *)&bytedata_err);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"blind_factor.GetData().GetHex().c_str()",
             "\"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179\"",
             local_88._M_dataplus._M_p,
             "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  std::__cxx11::string::~string((string *)&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata_err);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bytedata_err,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bytedata_err,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytedata_err);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bVar1 = cfd::core::BlindFactor::IsEmpty(&blind_factor);
  bytedata_err.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = !bVar1;
  bytedata_err.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)&bytedata_err,(AssertionResult *)"blind_factor.IsEmpty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_blindfactor.cpp"
               ,0x46,local_88._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&bytedata_err.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&local_88,"7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179",
             (allocator *)&gtest_ar_1);
  cfd::core::ByteData::ByteData(&bytedata_err,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_88,&bytedata_err);
    cfd::core::BlindFactor::operator=(&blind_factor,(BlindFactor *)&local_88);
    cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_88);
  }
  testing::Message::Message((Message *)&local_88);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_blindfactor.cpp"
             ,0x49,
             "Expected: (blind_factor = BlindFactor(bytedata_err)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_88);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata_err);
  cfd::core::BlindFactor::~BlindFactor(&blind_factor);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata);
  return;
}

Assistant:

TEST(BlindFactor, Constractor_bytedata) {
  ByteData bytedata(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  BlindFactor blind_factor(bytedata);
  EXPECT_STREQ(
      blind_factor.GetHex().c_str(),
      "7981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18");
  EXPECT_STREQ(
      blind_factor.GetData().GetHex().c_str(),
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_FALSE(blind_factor.IsEmpty());
  ByteData bytedata_err(
      "7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_THROW((blind_factor = BlindFactor(bytedata_err)), CfdException);
}